

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConditionalStatementSyntax::setChild
          (ConditionalStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b7340 + *(int *)(&DAT_015b7340 + in_RSI * 4)))();
  return;
}

Assistant:

void ConditionalStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: uniqueOrPriority = child.token(); return;
        case 3: ifKeyword = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: predicate = child.node() ? &child.node()->as<ConditionalPredicateSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        case 8: elseClause = child.node() ? &child.node()->as<ElseClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}